

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::recordPivots(HModel *this,int columnIn,int columnOut,double alpha)

{
  iterator iVar1;
  iterator __position;
  int local_20;
  int local_1c;
  double local_18;
  
  if (-1 < columnIn) {
    this->numberIteration = this->numberIteration + 1;
  }
  iVar1._M_current =
       (this->historyColumnIn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = columnOut;
  local_1c = columnIn;
  local_18 = alpha;
  if (iVar1._M_current ==
      (this->historyColumnIn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->historyColumnIn,iVar1,&local_1c);
  }
  else {
    *iVar1._M_current = columnIn;
    (this->historyColumnIn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->historyColumnOut).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->historyColumnOut).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->historyColumnOut,iVar1,&local_20);
  }
  else {
    *iVar1._M_current = columnOut;
    (this->historyColumnOut).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  __position._M_current =
       (this->historyAlpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->historyAlpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->historyAlpha,__position,&local_18);
  }
  else {
    *__position._M_current = alpha;
    (this->historyAlpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void HModel::recordPivots(int columnIn, int columnOut, double alpha) {
    if (columnIn >= 0) numberIteration++;
#ifdef JAJH_dev
    historyColumnIn.push_back(columnIn);
    historyColumnOut.push_back(columnOut);
    historyAlpha.push_back(alpha);
#endif
}